

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-non-blocking.c
# Opt level: O2

void thread_main(void *arg)

{
  ssize_t sVar1;
  int *piVar2;
  char buf [4096];
  
  uv_barrier_wait((uv_barrier_t *)arg);
  while( true ) {
    do {
      sVar1 = read(*(int *)((long)arg + 0x20),buf,0x1000);
    } while (0 < sVar1);
    if (sVar1 != -1) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
LAB_0013fa0c:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
              ,0x33,"n == 0");
      abort();
    }
  }
  if (sVar1 == 0) {
    return;
  }
  goto LAB_0013fa0c;
}

Assistant:

static void thread_main(void* arg) {
  struct thread_ctx* ctx;
  char buf[4096];
  ssize_t n;

  ctx = arg;
  uv_barrier_wait(&ctx->barrier);

  do
    n = read(ctx->fd, buf, sizeof(buf));
  while (n > 0 || (n == -1 && errno == EINTR));

  ASSERT(n == 0);
}